

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O2

Interval<float> pbrt::Sin<float>(Interval<float> i)

{
  undefined8 uVar1;
  bool bVar2;
  float fVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [16];
  float va;
  double vb;
  float local_2c;
  undefined1 local_28 [16];
  undefined1 local_18 [16];
  undefined1 extraout_var [60];
  
  auVar8._8_56_ = in_register_00001208;
  auVar8._0_8_ = i;
  va = i.low;
  vb = -1e-16;
  if (va < -1e-16) {
    LogFatal<char_const(&)[15],char_const(&)[7],char_const(&)[15],float&,char_const(&)[7],double&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math.h"
               ,0x4c5,"Check failed: %s >= %s with %s = %s, %s = %s",(char (*) [15])"i.LowerBound()"
               ,(char (*) [7])"-1e-16",(char (*) [15])"i.LowerBound()",&va,(char (*) [7])"-1e-16",
               &vb);
  }
  local_18 = auVar8._0_16_;
  local_28 = vmovshdup_avx(local_18);
  va = local_28._0_4_;
  vb = 6.283499641299248;
  if (va <= 6.2834997) {
    auVar6 = vmaxss_avx(local_18,ZEXT816(0) << 0x20);
    local_2c = sinf(auVar6._0_4_);
    auVar9._0_4_ = sinf((float)local_28._0_4_);
    auVar9._4_60_ = extraout_var;
    auVar6 = vmaxss_avx(ZEXT416((uint)local_2c),auVar9._0_16_);
    auVar10 = vminss_avx(auVar9._0_16_,ZEXT416((uint)local_2c));
    auVar7 = SUB6416(ZEXT464(0xff800000),0);
    if (-INFINITY < auVar10._0_4_) {
      auVar7._0_12_ = ZEXT812(0);
      auVar7._12_4_ = 0;
      uVar1 = vcmpss_avx512f(auVar10,auVar7,0);
      bVar4 = (bool)((byte)uVar1 & 1);
      fVar3 = (float)((uint)bVar4 * -0x80000000 + (uint)!bVar4 * (int)auVar10._0_4_);
      auVar7 = ZEXT416((int)fVar3 + -1 + (uint)(fVar3 <= 0.0) * 2);
    }
    auVar10 = SUB6416(ZEXT464(0x7f800000),0);
    if (auVar6._0_4_ < INFINITY) {
      auVar10._0_12_ = ZEXT812(0);
      auVar10._12_4_ = 0;
      uVar1 = vcmpss_avx512f(auVar6,auVar10,0);
      fVar3 = (float)((uint)!(bool)((byte)uVar1 & 1) * (int)auVar6._0_4_);
      auVar10 = ZEXT416((-(uint)(fVar3 < 0.0) | 1) + (int)fVar3);
    }
    auVar10 = vminss_avx(auVar10,SUB6416(ZEXT464(0x3f800000),0));
    auVar6 = vmaxss_avx(auVar7,SUB6416(ZEXT464(0xbf800000),0));
    uVar1 = vcmpss_avx512f(SUB6416(ZEXT464(0x3fc90fdb),0),local_28,2);
    bVar4 = (bool)((byte)uVar1 & 1);
    uVar1 = vcmpss_avx512f(local_18,SUB6416(ZEXT464(0x3fc90fdb),0),2);
    bVar2 = (bool)((byte)uVar1 & 1);
    auVar5._4_12_ = auVar10._4_12_;
    auVar5._0_4_ = (uint)bVar2 * ((uint)bVar4 * 0x3f800000 + (uint)!bVar4 * auVar10._0_4_) +
                   (uint)!bVar2 * auVar10._0_4_;
    uVar1 = vcmpss_avx512f(SUB6416(ZEXT464(0x4096cbe4),0),local_28,2);
    bVar4 = (bool)((byte)uVar1 & 1);
    uVar1 = vcmpss_avx512f(local_18,SUB6416(ZEXT464(0x4096cbe4),0),2);
    bVar2 = (bool)((byte)uVar1 & 1);
    auVar6._0_4_ = (uint)bVar2 * ((uint)bVar4 * -0x40800000 + (uint)!bVar4 * auVar6._0_4_) +
                   (uint)!bVar2 * auVar6._0_4_;
    auVar10 = vminss_avx(auVar5,auVar6);
    auVar6 = vmaxss_avx(auVar5,auVar6);
    auVar6 = vinsertps_avx(auVar10,auVar6,0x10);
    return auVar6._0_8_;
  }
  LogFatal<char_const(&)[15],char_const(&)[12],char_const(&)[15],float&,char_const(&)[12],double&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math.h"
             ,0x4c6,"Check failed: %s <= %s with %s = %s, %s = %s",(char (*) [15])"i.UpperBound()",
             (char (*) [12])"2.0001 * Pi",(char (*) [15])"i.UpperBound()",&va,
             (char (*) [12])"2.0001 * Pi",&vb);
}

Assistant:

PBRT_CPU_GPU inline Interval<Float> Sin(Interval<Float> i) {
    CHECK_GE(i.LowerBound(), -1e-16);
    CHECK_LE(i.UpperBound(), 2.0001 * Pi);
    Float low = std::sin(std::max<Float>(0, i.LowerBound()));
    Float high = std::sin(i.UpperBound());
    if (low > high)
        pstd::swap(low, high);
    low = std::max<Float>(-1, NextFloatDown(low));
    high = std::min<Float>(1, NextFloatUp(high));
    if (InRange(Pi / 2, i))
        high = 1;
    if (InRange((3.f / 2.f) * Pi, i))
        low = -1;

    return Interval<Float>(low, high);
}